

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O2

bool Lexer::inEnd(int nc)

{
  size_type sVar1;
  string name;
  allocator local_31;
  key_type local_30;
  
  std::__cxx11::string::string((string *)&local_30,"",&local_31);
  std::__cxx11::string::push_back((char)&local_30);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)endNum_abi_cxx11_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return sVar1 != 0;
}

Assistant:

bool inEnd(int nc){
		string name = "";
		name.push_back(nc);
		if(!endNum.count(name))return false;
		else return true;
	}